

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  bool bVar2;
  stbi_uc asVar3 [4];
  char cVar4;
  int iVar5;
  uint x_00;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  stbi_uc *data;
  stbi_uc *psVar10;
  char *pcVar11;
  byte *pbVar12;
  stbi_uc sVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uchar *puVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  long lVar21;
  undefined4 uVar22;
  undefined8 unaff_R15;
  uint *puVar23;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  size_t local_80;
  uint local_6c;
  stbi_uc local_68 [4];
  undefined4 local_64;
  uint local_60;
  uint local_5c;
  undefined4 local_58;
  uint local_54;
  ulong local_50;
  uint *local_48;
  uint local_3c;
  stbi_uc *local_38;
  
  pbVar9 = s->img_buffer;
  pbVar12 = s->img_buffer_end;
  local_48 = (uint *)y;
  local_3c = req_comp;
  if (pbVar9 < pbVar12) {
LAB_0015fd2d:
    s->img_buffer = pbVar9 + 1;
    local_6c = (uint)*pbVar9;
    pbVar9 = pbVar9 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      pbVar12 = s->img_buffer_end;
      goto LAB_0015fd2d;
    }
    local_6c = 0;
  }
  if (pbVar9 < pbVar12) {
LAB_0015fd68:
    s->img_buffer = pbVar9 + 1;
    uVar22 = (undefined4)CONCAT71((int7)((ulong)unaff_R15 >> 8),*pbVar9 != 0);
    pbVar9 = pbVar9 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      pbVar12 = s->img_buffer_end;
      goto LAB_0015fd68;
    }
    uVar22 = 0;
  }
  if (pbVar9 < pbVar12) {
LAB_0015fd9c:
    s->img_buffer = pbVar9 + 1;
    local_5c = (uint)CONCAT71((int7)((ulong)pbVar9 >> 8),*pbVar9);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_0015fd9c;
    }
    local_5c = 0;
  }
  iVar5 = stbi__get16le(s);
  local_54 = stbi__get16le(s);
  pbVar12 = s->img_buffer;
  local_58 = uVar22;
  if (pbVar12 < s->img_buffer_end) {
LAB_0015fdf4:
    s->img_buffer = pbVar12 + 1;
    uVar20 = (uint)*pbVar12;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar12 = s->img_buffer;
      goto LAB_0015fdf4;
    }
    uVar20 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar6 = stbi__get16le(s);
  uVar18 = (ulong)uVar6;
  pbVar9 = s->img_buffer;
  pbVar12 = s->img_buffer_end;
  if (pbVar9 < pbVar12) {
LAB_0015fe5d:
    s->img_buffer = pbVar9 + 1;
    local_60 = (uint)CONCAT71((int7)((ulong)pbVar9 >> 8),*pbVar9);
    pbVar9 = pbVar9 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      pbVar12 = s->img_buffer_end;
      goto LAB_0015fe5d;
    }
    local_60 = 0;
  }
  if (pbVar9 < pbVar12) {
LAB_0015fe90:
    pbVar12 = pbVar9 + 1;
    s->img_buffer = pbVar12;
    bVar25 = (*pbVar9 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_0015fe90;
    }
    bVar25 = true;
  }
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  cVar4 = (char)local_58;
  if ((char)local_58 != '\0') {
    local_64 = (undefined4)CONCAT71((int7)((ulong)pbVar9 >> 8),1);
    if (uVar20 < 0x18) {
      if (uVar20 - 0xf < 2) {
LAB_0015ff4d:
        local_80 = 3;
        bVar2 = true;
        local_64 = 0;
        goto LAB_0015ffc6;
      }
      if (uVar20 == 8) goto LAB_0015ffb4;
    }
    else if ((uVar20 == 0x18) || (uVar20 == 0x20)) {
      local_80 = (size_t)(uVar20 >> 3);
      goto LAB_0015ffbe;
    }
LAB_001600a4:
    pcVar11 = "Can\'t find out TGA pixelformat";
    goto LAB_00160460;
  }
  local_64 = (undefined4)CONCAT71((int7)((ulong)pbVar12 >> 8),1);
  uVar20 = local_60 & 0xff;
  if ((local_60 & 0xff) < 0x10) {
    if ((local_60 & 0xff) != 8) {
      if (uVar20 == 0xf) goto LAB_0015ff4d;
      goto LAB_001600a4;
    }
LAB_0015ffb4:
    local_80 = 1;
  }
  else if ((uVar20 == 0x20) || (uVar20 == 0x18)) {
    local_80 = (size_t)(byte)((byte)local_60 >> 3);
  }
  else {
    if (uVar20 != 0x10) goto LAB_001600a4;
    uVar20 = (local_5c & 0xff) - 8;
    if ((byte)local_5c < 8) {
      uVar20 = local_5c & 0xff;
    }
    if (uVar20 != 3) goto LAB_0015ff4d;
    local_80 = 2;
  }
LAB_0015ffbe:
  bVar2 = false;
LAB_0015ffc6:
  *x = x_00;
  *local_48 = uVar6;
  uVar20 = (uint)local_80;
  if (comp != (int *)0x0) {
    *comp = uVar20;
  }
  iVar7 = stbi__mad3sizes_valid(x_00,uVar6,uVar20,0);
  if (iVar7 != 0) {
    data = (stbi_uc *)stbi__malloc_mad3(x_00,uVar6,uVar20,0);
    if (data == (uchar *)0x0) {
LAB_00160459:
      pcVar11 = "Out of memory";
      goto LAB_00160460;
    }
    bVar24 = (byte)local_5c < 8;
    stbi__skip(s,local_6c);
    uVar15 = local_54;
    local_50 = uVar18;
    if ((cVar4 == '\0' && !bVar2) && bVar24) {
      if (uVar6 != 0) {
        uVar15 = 0;
        do {
          uVar6 = uVar6 - 1;
          uVar8 = uVar15;
          if (bVar25) {
            uVar8 = uVar6;
          }
          stbi__getn(s,data + (int)(uVar8 * uVar20 * x_00),uVar20 * x_00);
          uVar15 = uVar15 + 1;
        } while (uVar6 != 0);
      }
      goto LAB_001603d9;
    }
    if (cVar4 == '\0') {
      psVar10 = (stbi_uc *)0x0;
    }
    else {
      if (local_54 == 0) {
LAB_00160443:
        free(data);
        goto LAB_00160448;
      }
      stbi__skip(s,iVar5);
      psVar10 = (stbi_uc *)stbi__malloc_mad2(uVar15,uVar20,0);
      if (psVar10 == (stbi_uc *)0x0) {
        free(data);
        goto LAB_00160459;
      }
      if ((char)local_64 == '\0') {
        if (uVar20 != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                        ,0x1691,
                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        lVar21 = 0;
        do {
          uVar6 = stbi__get16le(s);
          psVar10[lVar21] = (stbi_uc)(((uVar6 >> 10 & 0x1f) * 0xff) / 0x1f);
          psVar10[lVar21 + 1] = (stbi_uc)(((uVar6 >> 5 & 0x1f) * 0xff) / 0x1f);
          psVar10[lVar21 + 2] = (stbi_uc)(((uVar6 & 0x1f) * 0xff) / 0x1f);
          lVar21 = lVar21 + 3;
          uVar18 = local_50;
        } while (uVar15 * 3 != (int)lVar21);
      }
      else {
        iVar5 = stbi__getn(s,psVar10,uVar20 * uVar15);
        if (iVar5 == 0) {
          free(data);
          data = psVar10;
          goto LAB_00160443;
        }
      }
    }
    iVar5 = (int)uVar18;
    local_38 = psVar10;
    if (iVar5 * x_00 != 0) {
      local_48 = (uint *)(ulong)(iVar5 * x_00);
      bVar24 = true;
      puVar23 = (uint *)0x0;
      local_6c = 0;
      iVar7 = 0;
      do {
        if ((byte)local_5c < 8) {
LAB_001601bc:
          if ((char)local_58 == '\0') {
            if ((char)local_64 == '\0') {
              if (uVar20 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                              ,0x16c2,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              uVar6 = stbi__get16le(s);
              asVar3 = local_68;
              local_68[1] = (char)(((uVar6 >> 5 & 0x1f) * 0xff) / 0x1f);
              local_68[0] = (char)(((uVar6 >> 10 & 0x1f) * 0xff) / 0x1f);
              local_68[3] = asVar3[3];
              local_68[2] = (char)(((uVar6 & 0x1f) * 0xff) / 0x1f);
              goto LAB_00160322;
            }
            if (uVar20 != 0) {
              psVar10 = s->img_buffer;
              sVar19 = 0;
              do {
                if (psVar10 < s->img_buffer_end) {
LAB_00160247:
                  s->img_buffer = psVar10 + 1;
                  sVar13 = *psVar10;
                  psVar10 = psVar10 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar10 = s->img_buffer;
                    goto LAB_00160247;
                  }
                  sVar13 = '\0';
                }
                local_68[sVar19] = sVar13;
                sVar19 = sVar19 + 1;
                uVar18 = local_50;
              } while (local_80 != sVar19);
              goto LAB_0016031b;
            }
          }
          else {
            if ((char)local_60 == '\b') {
              pbVar12 = s->img_buffer;
              if (s->img_buffer_end <= pbVar12) {
                if (s->read_from_callbacks == 0) {
                  uVar6 = 0;
                  goto LAB_00160277;
                }
                stbi__refill_buffer(s);
                pbVar12 = s->img_buffer;
              }
              s->img_buffer = pbVar12 + 1;
              uVar6 = (uint)*pbVar12;
            }
            else {
              uVar6 = stbi__get16le(s);
            }
LAB_00160277:
            if (uVar20 != 0) {
              if (local_54 <= uVar6) {
                uVar6 = 0;
              }
              memcpy(local_68,local_38 + uVar6 * uVar20,local_80);
              goto LAB_00160322;
            }
          }
        }
        else {
          if (iVar7 == 0) {
            pbVar12 = s->img_buffer;
            if (pbVar12 < s->img_buffer_end) {
LAB_0016019d:
              s->img_buffer = pbVar12 + 1;
              local_6c = (uint)*pbVar12;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar12 = s->img_buffer;
                goto LAB_0016019d;
              }
              local_6c = 0;
            }
            iVar7 = (local_6c & 0x7f) + 1;
            local_6c = local_6c >> 7;
            goto LAB_001601bc;
          }
          bVar26 = local_6c != 0;
          local_6c = 1;
          if (!bVar26 || bVar24) {
            local_6c = (uint)bVar26;
            goto LAB_001601bc;
          }
LAB_0016031b:
          if (uVar20 != 0) {
LAB_00160322:
            memcpy(data + uVar20 * (int)puVar23,local_68,local_80);
          }
        }
        iVar5 = (int)uVar18;
        iVar7 = iVar7 + -1;
        puVar23 = (uint *)((long)puVar23 + 1);
        bVar24 = false;
      } while (puVar23 != local_48);
    }
    if (bVar25 && iVar5 != 0) {
      iVar7 = uVar20 * x_00;
      iVar14 = iVar7 * (iVar5 - 1U);
      uVar15 = 0;
      uVar6 = 0;
      do {
        if (iVar7 != 0) {
          puVar17 = data;
          iVar16 = iVar7 + 1;
          do {
            uVar1 = puVar17[uVar15];
            puVar17[uVar15] = puVar17[iVar14];
            puVar17[iVar14] = uVar1;
            puVar17 = puVar17 + 1;
            iVar16 = iVar16 + -1;
          } while (1 < iVar16);
        }
        iVar14 = iVar14 - iVar7;
        uVar15 = uVar15 + iVar7;
        bVar25 = uVar6 != iVar5 - 1U >> 1;
        uVar6 = uVar6 + 1;
      } while (bVar25);
    }
    if (local_38 != (stbi_uc *)0x0) {
      free(local_38);
    }
LAB_001603d9:
    if ((!bVar2 && 2 < uVar20) && (iVar5 = (uint)local_50 * x_00, iVar5 != 0)) {
      puVar17 = data + 2;
      do {
        uVar1 = puVar17[-2];
        puVar17[-2] = *puVar17;
        *puVar17 = uVar1;
        puVar17 = puVar17 + local_80;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    if (local_3c == 0) {
      return data;
    }
    if (uVar20 == local_3c) {
      return data;
    }
    puVar17 = stbi__convert_format(data,uVar20,local_3c,x_00,(uint)local_50);
    return puVar17;
  }
LAB_00160448:
  pcVar11 = "Corrupt TGA";
LAB_00160460:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar11;
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}